

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall
memory::
Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
::
Array<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
          (Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
           *this,ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *other)

{
  size_type n;
  HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_> local_31;
  view_type local_30;
  ArrayView<value_type,_HostCoordinator<value_type,_Allocator<double,_AlignedPolicy<8UL>_>_>_>
  *local_18;
  ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *other_local;
  Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  *this_local;
  
  local_18 = &other->
              super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ;
  other_local = (ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *)this;
  n = ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
      ::size(&other->
              super_ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
            );
  HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            (&local_30,&local_31,n);
  ArrayViewImpl<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>,double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
  ::
  ArrayViewImpl<memory::ArrayViewImpl<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>,double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((ArrayViewImpl<memory::ArrayReference<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>,double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
              *)this,&local_30);
  ArrayViewImpl<memory::ArrayReference<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>,_double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
  ::~ArrayViewImpl(&local_30);
  HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),local_18,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<double,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(Other&& other)
        : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(other, *this);
    }